

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

char __thiscall Fl_Preferences::get(Fl_Preferences *this,char *key,int *value,int defaultValue)

{
  Node *this_00;
  uint uVar1;
  char *__nptr;
  
  this_00 = this->node;
  uVar1 = Node::getEntry(this_00,key);
  if ((int)uVar1 < 0) {
    __nptr = (char *)0x0;
  }
  else {
    __nptr = this_00->entry_[uVar1].value;
  }
  if (__nptr != (char *)0x0) {
    defaultValue = atoi(__nptr);
  }
  *value = defaultValue;
  return __nptr != (char *)0x0;
}

Assistant:

char Fl_Preferences::get( const char *key, int &value, int defaultValue ) {
  const char *v = node->get( key );
  value = v ? atoi( v ) : defaultValue;
  return ( v != 0 );
}